

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O2

LispPTR COM_next_file(LispPTR *args)

{
  uint uVar1;
  FINFO *pFVar2;
  FPROP *pFVar3;
  DLword *pDVar4;
  int iVar5;
  LispPTR LVar6;
  LispPTR *pLVar7;
  LispPTR *pLVar8;
  ulong uVar9;
  long lVar10;
  ulong x;
  
  iVar5 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar5 == 0) {
    Lisp_errno = &Dummy_errno;
    pLVar7 = NativeAligned4FromLAddr(*args);
    lVar10 = (long)(int)*pLVar7;
    LVar6 = 0xfffff;
    if ((-1 < lVar10) && ((int)*pLVar7 < MAXFINFO)) {
      pFVar2 = FinfoArray[lVar10].next;
      if (pFVar2 != (FINFO *)0x0 && FinfoArray[lVar10].head != (FINFO *)0x0) {
        LVar6 = pLVar7[4];
        FinfoArray[lVar10].next = pFVar2->next;
        pLVar8 = NativeAligned4FromLAddr(pLVar7[7]);
        pDVar4 = Lisp_world;
        uVar1 = *pLVar8;
        for (uVar9 = 0; x = pFVar2->lname_len, uVar9 < x; uVar9 = uVar9 + 1) {
          *(char *)((long)pDVar4 + uVar9 + (uVar1 & 0xfffffff) * 2 ^ 3) = pFVar2->lname[uVar9];
        }
        if ((int)LVar6 < 0) {
          pFVar3 = pFVar2->prop;
          pLVar7[8] = pFVar3->length;
          pLVar7[9] = pFVar3->wdate;
          pLVar7[10] = pFVar3->rdate;
          pLVar7[0xb] = pFVar3->protect;
          pLVar8 = NativeAligned4FromLAddr(pLVar7[0xc]);
          pDVar4 = Lisp_world;
          uVar1 = *pLVar8;
          for (uVar9 = 0; uVar9 < pFVar3->au_len; uVar9 = uVar9 + 1) {
            *(char *)((long)pDVar4 + uVar9 + (uVar1 & 0xfffffff) * 2 ^ 3) = pFVar3->author[uVar9];
          }
          pLVar7[0xd] = (LispPTR)pFVar3->au_len;
          x = pFVar2->lname_len;
        }
        LVar6 = GetPosSmallp(x);
      }
    }
  }
  else {
    *Lisp_errno = 100;
    LVar6 = 0xfffff;
  }
  return LVar6;
}

Assistant:

LispPTR COM_next_file(LispPTR *args)
{
  LispPTR laddr;
  FPROP *pp;
  FINFO *fp;
  char *base;
  DFINFO *dfp;
  UFSGFS *gfsp;
  int finfoid;
  unsigned propp;

  ERRSETJMP(SMALLP_MINUSONE);
  Lisp_errno = &Dummy_errno;

  gfsp = (UFSGFS *)(NativeAligned4FromLAddr(args[0]));

  finfoid = (int)gfsp->finfoid;

  if (finfoid < 0 || MAXFINFO - 1 < finfoid) return (SMALLP_MINUSONE);

  propp = gfsp->propp;

  dfp = &FinfoArray[finfoid];
  fp = dfp->next;
  if (dfp->head == NULL || fp == NULL) return (SMALLP_MINUSONE);
  dfp->next = fp->next;

  laddr = gfsp->name;
  STRING_BASE(laddr, base);
#ifndef BYTESWAP
  strncpy(base, fp->lname, fp->lname_len);
#else
  StrNCpyFromCToLisp(base, fp->lname, fp->lname_len);
#endif /* BYTESWAP	 */

  if (!propp) return (GetPosSmallp(fp->lname_len));

  pp = fp->prop;
  gfsp->length = pp->length;
  gfsp->wdate = pp->wdate;
  gfsp->rdate = pp->rdate;
  gfsp->protection = pp->protect;

  laddr = gfsp->author;
  STRING_BASE(laddr, base);
#ifndef BYTESWAP
  strncpy(base, pp->author, pp->au_len);
#else
  StrNCpyFromCToLisp(base, pp->author, pp->au_len);
#endif /* BYTESWAP	 */

  gfsp->aulen = pp->au_len;

  return (GetPosSmallp(fp->lname_len));
}